

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

Totals * __thiscall
Catch::anon_unknown_26::TestGroup::execute(Totals *__return_storage_ptr__,TestGroup *this)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  pointer pFVar3;
  int iVar4;
  _Base_ptr p_Var5;
  FilterMatch *match;
  pointer pFVar6;
  Totals local_70;
  
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->testCases).skipped = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->assertions).skipped = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  p_Var5 = (this->m_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_tests)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var1) {
    do {
      uVar2 = (this->m_context).m_totals.assertions.failed;
      iVar4 = (*((this->m_context).m_config)->_vptr_IConfig[9])();
      if (uVar2 < (ulong)(long)iVar4) {
        RunContext::runTest(&local_70,&this->m_context,*(TestCaseHandle **)(p_Var5 + 1));
        Totals::operator+=(__return_storage_ptr__,&local_70);
      }
      else {
        (*this->m_reporter->_vptr_IEventListener[0x12])
                  (this->m_reporter,**(undefined8 **)(p_Var5 + 1));
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  pFVar3 = (this->m_matches).
           super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pFVar6 = (this->m_matches).
                super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar6 != pFVar3; pFVar6 = pFVar6 + 1) {
    if ((pFVar6->tests).
        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pFVar6->tests).
        super__Vector_base<const_Catch::TestCaseHandle_*,_std::allocator<const_Catch::TestCaseHandle_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this->m_unmatchedTestSpecs = true;
      (*this->m_reporter->_vptr_IEventListener[2])
                (this->m_reporter,(pFVar6->name)._M_dataplus._M_p,(pFVar6->name)._M_string_length);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Totals execute() {
                Totals totals;
                for (auto const& testCase : m_tests) {
                    if (!m_context.aborting())
                        totals += m_context.runTest(*testCase);
                    else
                        m_reporter->skipTest(testCase->getTestCaseInfo());
                }

                for (auto const& match : m_matches) {
                    if (match.tests.empty()) {
                        m_unmatchedTestSpecs = true;
                        m_reporter->noMatchingTestCases( match.name );
                    }
                }

                return totals;
            }